

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImStristr(char *haystack,char *haystack_end,char *needle,char *needle_end)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  
  if (needle_end == (char *)0x0) {
    sVar5 = strlen(needle);
    needle_end = needle + sVar5;
  }
  iVar2 = toupper((int)*needle);
  do {
    if (haystack_end == (char *)0x0) {
      if (*haystack == '\0') {
        return (char *)0x0;
      }
    }
    else if (haystack_end <= haystack) {
      return (char *)0x0;
    }
    iVar3 = toupper((int)*haystack);
    if (iVar3 == (char)iVar2) {
      lVar6 = 1;
      do {
        pcVar1 = needle + lVar6;
        if (needle_end <= pcVar1) break;
        iVar3 = toupper((int)haystack[lVar6]);
        iVar4 = toupper((int)*pcVar1);
        lVar6 = lVar6 + 1;
      } while (iVar3 == iVar4);
      if (pcVar1 == needle_end) {
        return haystack;
      }
    }
    haystack = haystack + 1;
  } while( true );
}

Assistant:

const char* ImStristr(const char* haystack, const char* haystack_end, const char* needle, const char* needle_end)
{
    if (!needle_end)
        needle_end = needle + strlen(needle);

    const char un0 = (char)toupper(*needle);
    while ((!haystack_end && *haystack) || (haystack_end && haystack < haystack_end))
    {
        if (toupper(*haystack) == un0)
        {
            const char* b = needle + 1;
            for (const char* a = haystack + 1; b < needle_end; a++, b++)
                if (toupper(*a) != toupper(*b))
                    break;
            if (b == needle_end)
                return haystack;
        }
        haystack++;
    }
    return NULL;
}